

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

void Au_NtkFree(Au_Ntk_t *p)

{
  Au_Ntk_t *p_local;
  
  Au_ManFree(p->pMan);
  Vec_PtrFreeFree(p->vChunks);
  if ((p->vCopies).pArray != (int *)0x0) {
    free((p->vCopies).pArray);
    (p->vCopies).pArray = (int *)0x0;
  }
  if ((p->vPages).pArray != (void **)0x0) {
    free((p->vPages).pArray);
    (p->vPages).pArray = (void **)0x0;
  }
  if ((p->vObjs).pArray != (int *)0x0) {
    free((p->vObjs).pArray);
    (p->vObjs).pArray = (int *)0x0;
  }
  if ((p->vPis).pArray != (int *)0x0) {
    free((p->vPis).pArray);
    (p->vPis).pArray = (int *)0x0;
  }
  if ((p->vPos).pArray != (int *)0x0) {
    free((p->vPos).pArray);
    (p->vPos).pArray = (int *)0x0;
  }
  if (p->pHTable != (int *)0x0) {
    free(p->pHTable);
    p->pHTable = (int *)0x0;
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p != (Au_Ntk_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Au_NtkFree( Au_Ntk_t * p )
{
    Au_ManFree( p->pMan );
    Vec_PtrFreeFree( p->vChunks );
    ABC_FREE( p->vCopies.pArray );
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vObjs.pArray );
    ABC_FREE( p->vPis.pArray );
    ABC_FREE( p->vPos.pArray );
    ABC_FREE( p->pHTable );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}